

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BLBackTrace.cpp
# Opt level: O0

string * amrex::anon_unknown_5::run_command(string *cmd)

{
  char *pcVar1;
  string *in_RDI;
  char print_buff [512];
  FILE *ps;
  string *r;
  char local_238 [536];
  FILE *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_20 = popen(pcVar1,"r");
  if (local_20 != (FILE *)0x0) {
    while (pcVar1 = fgets(local_238,0x200,local_20), pcVar1 != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)in_RDI,local_238);
    }
    pclose(local_20);
  }
  return in_RDI;
}

Assistant:

std::string run_command (std::string const& cmd)
    {
        std::string r;
        if (FILE * ps = popen(cmd.c_str(), "r")) {
            char print_buff[512];
            while (fgets(print_buff, sizeof(print_buff), ps)) {
                r += print_buff;
            }
            pclose(ps);
        }
        return r;
    }